

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLString.cpp
# Opt level: O1

String * MathML::StringUtil::replaceAll
                   (String *__return_storage_ptr__,String *str,char pattern,char replacement)

{
  pointer pcVar1;
  long lVar2;
  undefined7 in_register_00000011;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  lVar2 = std::__cxx11::string::find
                    ((char)__return_storage_ptr__,
                     CONCAT71(in_register_00000011,pattern) & 0xffffffff);
  if (lVar2 != -1) {
    do {
      (__return_storage_ptr__->_M_dataplus)._M_p[lVar2] = replacement;
      lVar2 = std::__cxx11::string::find((char)__return_storage_ptr__,(ulong)(uint)(int)pattern);
    } while (lVar2 != -1);
  }
  return __return_storage_ptr__;
}

Assistant:

MathML::String StringUtil::replaceAll( const String& str, char pattern, char replacement )
    {
        String string = str;

        size_t position = string.find( pattern );

        while ( position != String::npos )
        {
            string[ position ] = replacement;
            position = string.find( pattern );
        }

        return string;
    }